

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

bool __thiscall
Centaurus::NFA<char>::epsilon_closure_sub
          (NFA<char> *this,set<int,_std::less<int>,_std::allocator<int>_> *closure,int index)

{
  byte bVar1;
  bool bVar2;
  const_reference this_00;
  reference piVar3;
  iterator iStack_70;
  int dest;
  iterator __end2;
  iterator __begin2;
  IndexVector *__range2;
  IndexVector et;
  bool long_flag;
  int local_1c;
  set<int,_std::less<int>,_std::allocator<int>_> *psStack_18;
  int index_local;
  set<int,_std::less<int>,_std::allocator<int>_> *closure_local;
  NFA<char> *this_local;
  
  local_1c = index;
  psStack_18 = closure;
  closure_local = (set<int,_std::less<int>,_std::allocator<int>_> *)this;
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert(closure,&local_1c);
  et.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  this_00 = std::
            vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
            ::operator[](&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states,
                         (long)local_1c);
  NFABaseState<char,_int>::epsilon_transitions
            ((IndexVector *)&__range2,this_00,
             (bool *)((long)&et.super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
  __end2 = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&et);
  iStack_70 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&et);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff90);
    bVar1 = et.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end2);
    bVar2 = epsilon_closure_sub(this,psStack_18,*piVar3);
    et.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._7_1_ =
         (et.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0 || bVar2;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  IndexVector::~IndexVector((IndexVector *)&__range2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool epsilon_closure_sub(std::set<int>& closure, int index) const
    {
        //Always include myself
        closure.insert(index);

        bool long_flag = false;
        IndexVector et = m_states[index].epsilon_transitions(long_flag);

        for (int dest : et)
        {
            long_flag |= epsilon_closure_sub(closure, dest);
        }
        return long_flag;
    }